

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::DynamicMapField::SyncRepeatedFieldWithMapNoLock(DynamicMapField *this)

{
  Rep *this_00;
  MapKey *pMVar1;
  FieldDescriptor *pFVar2;
  bool bVar3;
  int iVar4;
  CppType CVar5;
  int32 iVar6;
  uint32 uVar7;
  undefined4 extraout_var;
  Descriptor *pDVar8;
  FieldDescriptor *pFVar9;
  RepeatedPtrField<google::protobuf::Message> *pRVar10;
  undefined4 extraout_var_00;
  string *psVar11;
  int64 iVar12;
  uint64 uVar13;
  LogMessage *other;
  const_pointer pvVar14;
  MapValueRef *this_01;
  Message *pMVar15;
  long *plVar16;
  Message *message;
  MapValueRef *map_val;
  LogMessage local_158;
  const_pointer local_120;
  MapKey *map_key;
  Message *new_entry;
  undefined1 local_f8 [8];
  const_iterator it;
  string local_d8;
  FieldDescriptor *local_b8;
  FieldDescriptor *val_des;
  allocator local_99;
  string local_98;
  FieldDescriptor *local_78;
  FieldDescriptor *key_des;
  Reflection *reflection;
  DynamicMapField *this_local;
  Rep *local_50;
  RepeatedPtrField<google::protobuf::Message> *local_48;
  RepeatedPtrField<google::protobuf::Message> local_40;
  RepeatedPtrField<google::protobuf::Message> *local_28;
  RepeatedPtrField<google::protobuf::Message> *t;
  byte local_11;
  Rep *local_10;
  
  reflection = (Reflection *)this;
  iVar4 = (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x16])();
  key_des = (FieldDescriptor *)CONCAT44(extraout_var,iVar4);
  pDVar8 = Message::GetDescriptor(this->default_entry_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,"key",&local_99);
  pFVar9 = Descriptor::FindFieldByName(pDVar8,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  local_78 = pFVar9;
  pDVar8 = Message::GetDescriptor(this->default_entry_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_d8,"value",(allocator *)((long)&it.it_.bucket_index_ + 7));
  pFVar9 = Descriptor::FindFieldByName(pDVar8,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&it.it_.bucket_index_ + 7));
  local_b8 = pFVar9;
  if ((this->super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>)
      .super_MapFieldBase.repeated_field_ == (RepeatedPtrField<google::protobuf::Message> *)0x0) {
    if ((this->
        super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
        super_MapFieldBase.arena_ == (Arena *)0x0) {
      pRVar10 = (RepeatedPtrField<google::protobuf::Message> *)operator_new(0x18);
      RepeatedPtrField<google::protobuf::Message>::RepeatedPtrField(pRVar10);
      (this->super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>)
      .super_MapFieldBase.repeated_field_ = pRVar10;
    }
    else {
      this_00 = (Rep *)(this->
                       super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                       ).super_MapFieldBase.arena_;
      local_50 = this_00;
      if (this_00 == (Rep *)0x0) {
        pRVar10 = (RepeatedPtrField<google::protobuf::Message> *)operator_new(0x18);
        RepeatedPtrField<google::protobuf::Message>::RepeatedPtrField(pRVar10);
        local_48 = pRVar10;
      }
      else {
        local_40.super_RepeatedPtrFieldBase.current_size_ = 0;
        local_40.super_RepeatedPtrFieldBase.total_size_ = 0;
        local_40.super_RepeatedPtrFieldBase.rep_ = this_00;
        local_11 = Arena::
                   SkipDeleteList<google::protobuf::RepeatedPtrField<google::protobuf::Message>>(0);
        t = &local_40;
        local_40.super_RepeatedPtrFieldBase.arena_ = (Arena *)this_00;
        local_10 = this_00;
        pRVar10 = (RepeatedPtrField<google::protobuf::Message> *)
                  Arena::AllocateAligned
                            ((Arena *)this_00,
                             (type_info *)&RepeatedPtrField<google::protobuf::Message>::typeinfo,
                             0x18);
        RepeatedPtrField<google::protobuf::Message>::RepeatedPtrField
                  (pRVar10,(t->super_RepeatedPtrFieldBase).arena_);
        local_28 = pRVar10;
        if ((local_11 & 1) == 0) {
          Arena::AddListNode((Arena *)this_00,pRVar10,
                             arena_destruct_object<google::protobuf::RepeatedPtrField<google::protobuf::Message>>
                            );
        }
        local_48 = local_28;
      }
      (this->super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>)
      .super_MapFieldBase.repeated_field_ = local_48;
    }
  }
  RepeatedPtrField<google::protobuf::Message>::Clear
            ((this->
             super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>)
             .super_MapFieldBase.repeated_field_);
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::begin
            ((const_iterator *)local_f8,&this->map_);
  while( true ) {
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::end
              ((const_iterator *)&new_entry,&this->map_);
    bVar3 = protobuf::operator!=((const_iterator *)local_f8,(const_iterator *)&new_entry);
    if (!bVar3) break;
    iVar4 = (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[3])();
    map_key = (MapKey *)CONCAT44(extraout_var_00,iVar4);
    RepeatedPtrField<google::protobuf::Message>::AddAllocated
              ((this->
               super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
               ).super_MapFieldBase.repeated_field_,(Message *)map_key);
    local_120 = Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::const_iterator::
                operator->((const_iterator *)local_f8);
    CVar5 = FieldDescriptor::cpp_type(local_78);
    pFVar2 = key_des;
    pFVar9 = local_78;
    pMVar1 = map_key;
    switch(CVar5) {
    case CPPTYPE_INT32:
      iVar6 = MapKey::GetInt32Value(&local_120->first);
      (**(code **)(*(long *)pFVar2 + 0xe8))(pFVar2,pMVar1,pFVar9,iVar6);
      break;
    case CPPTYPE_INT64:
      iVar12 = MapKey::GetInt64Value(&local_120->first);
      (**(code **)(*(long *)pFVar2 + 0xf0))(pFVar2,pMVar1,pFVar9,iVar12);
      break;
    case CPPTYPE_UINT32:
      uVar7 = MapKey::GetUInt32Value(&local_120->first);
      (**(code **)(*(long *)pFVar2 + 0xf8))(pFVar2,pMVar1,pFVar9,uVar7);
      break;
    case CPPTYPE_UINT64:
      uVar13 = MapKey::GetUInt64Value(&local_120->first);
      (**(code **)(*(long *)pFVar2 + 0x100))(pFVar2,pMVar1,pFVar9,uVar13);
      break;
    case CPPTYPE_DOUBLE:
    case CPPTYPE_FLOAT:
    case CPPTYPE_ENUM:
    case CPPTYPE_MESSAGE:
      LogMessage::LogMessage
                (&local_158,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/map_field.cc"
                 ,0x11c);
      other = LogMessage::operator<<(&local_158,"Can\'t get here.");
      LogFinisher::operator=((LogFinisher *)((long)&map_val + 7),other);
      LogMessage::~LogMessage(&local_158);
      break;
    case CPPTYPE_BOOL:
      bVar3 = MapKey::GetBoolValue(&local_120->first);
      (**(code **)(*(long *)pFVar2 + 0x118))(pFVar2,pMVar1,pFVar9,bVar3);
      break;
    case CPPTYPE_STRING:
      psVar11 = MapKey::GetStringValue_abi_cxx11_(&local_120->first);
      (**(code **)(*(long *)pFVar2 + 0x120))(pFVar2,pMVar1,pFVar9,psVar11);
    }
    pvVar14 = Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::const_iterator::
              operator->((const_iterator *)local_f8);
    this_01 = &pvVar14->second;
    CVar5 = FieldDescriptor::cpp_type(local_b8);
    pFVar2 = key_des;
    pFVar9 = local_b8;
    pMVar1 = map_key;
    switch(CVar5) {
    case CPPTYPE_INT32:
      iVar6 = MapValueRef::GetInt32Value(this_01);
      (**(code **)(*(long *)pFVar2 + 0xe8))(pFVar2,pMVar1,pFVar9,iVar6);
      break;
    case CPPTYPE_INT64:
      iVar12 = MapValueRef::GetInt64Value(this_01);
      (**(code **)(*(long *)pFVar2 + 0xf0))(pFVar2,pMVar1,pFVar9,iVar12);
      break;
    case CPPTYPE_UINT32:
      uVar7 = MapValueRef::GetUInt32Value(this_01);
      (**(code **)(*(long *)pFVar2 + 0xf8))(pFVar2,pMVar1,pFVar9,uVar7);
      break;
    case CPPTYPE_UINT64:
      uVar13 = MapValueRef::GetUInt64Value(this_01);
      (**(code **)(*(long *)pFVar2 + 0x100))(pFVar2,pMVar1,pFVar9,uVar13);
      break;
    case CPPTYPE_DOUBLE:
      MapValueRef::GetDoubleValue(this_01);
      (**(code **)(*(long *)pFVar2 + 0x110))(pFVar2,pMVar1,pFVar9);
      break;
    case CPPTYPE_FLOAT:
      MapValueRef::GetFloatValue(this_01);
      (**(code **)(*(long *)pFVar2 + 0x108))(pFVar2,pMVar1,pFVar9);
      break;
    case CPPTYPE_BOOL:
      bVar3 = MapValueRef::GetBoolValue(this_01);
      (**(code **)(*(long *)pFVar2 + 0x118))(pFVar2,pMVar1,pFVar9,bVar3);
      break;
    case CPPTYPE_ENUM:
      iVar4 = MapValueRef::GetEnumValue(this_01);
      (**(code **)(*(long *)pFVar2 + 0x130))(pFVar2,pMVar1,pFVar9,iVar4);
      break;
    case CPPTYPE_STRING:
      psVar11 = MapValueRef::GetStringValue_abi_cxx11_(this_01);
      (**(code **)(*(long *)pFVar2 + 0x120))(pFVar2,pMVar1,pFVar9,psVar11);
      break;
    case CPPTYPE_MESSAGE:
      pMVar15 = MapValueRef::GetMessageValue(this_01);
      plVar16 = (long *)(**(code **)(*(long *)key_des + 0x138))(key_des,map_key,local_b8,0);
      (**(code **)(*plVar16 + 0x88))(plVar16,pMVar15);
    }
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::const_iterator::operator++
              ((const_iterator *)local_f8);
  }
  return;
}

Assistant:

void DynamicMapField::SyncRepeatedFieldWithMapNoLock() const {
  const Reflection* reflection = default_entry_->GetReflection();
  const FieldDescriptor* key_des =
      default_entry_->GetDescriptor()->FindFieldByName("key");
  const FieldDescriptor* val_des =
      default_entry_->GetDescriptor()->FindFieldByName("value");
  if (MapFieldBase::repeated_field_ == NULL) {
    if (MapFieldBase::arena_ == NULL) {
      MapFieldBase::repeated_field_ = new RepeatedPtrField<Message>();
    } else {
      MapFieldBase::repeated_field_ =
          Arena::CreateMessage<RepeatedPtrField<Message> >(
              MapFieldBase::arena_);
    }
  }

  MapFieldBase::repeated_field_->Clear();

  for (Map<MapKey, MapValueRef>::const_iterator it = map_.begin();
       it != map_.end(); ++it) {
    Message* new_entry = default_entry_->New();
    MapFieldBase::repeated_field_->AddAllocated(new_entry);
    const MapKey& map_key = it->first;
    switch (key_des->cpp_type()) {
      case google::protobuf::FieldDescriptor::CPPTYPE_STRING:
        reflection->SetString(new_entry, key_des, map_key.GetStringValue());
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_INT64:
        reflection->SetInt64(new_entry, key_des, map_key.GetInt64Value());
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_INT32:
        reflection->SetInt32(new_entry, key_des, map_key.GetInt32Value());
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_UINT64:
        reflection->SetUInt64(new_entry, key_des, map_key.GetUInt64Value());
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_UINT32:
        reflection->SetUInt32(new_entry, key_des, map_key.GetUInt32Value());
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_BOOL:
        reflection->SetBool(new_entry, key_des, map_key.GetBoolValue());
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_DOUBLE:
      case google::protobuf::FieldDescriptor::CPPTYPE_FLOAT:
      case google::protobuf::FieldDescriptor::CPPTYPE_ENUM:
      case google::protobuf::FieldDescriptor::CPPTYPE_MESSAGE:
        GOOGLE_LOG(FATAL) << "Can't get here.";
        break;
    }
    const MapValueRef& map_val = it->second;
    switch (val_des->cpp_type()) {
      case google::protobuf::FieldDescriptor::CPPTYPE_STRING:
        reflection->SetString(new_entry, val_des, map_val.GetStringValue());
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_INT64:
        reflection->SetInt64(new_entry, val_des, map_val.GetInt64Value());
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_INT32:
        reflection->SetInt32(new_entry, val_des, map_val.GetInt32Value());
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_UINT64:
        reflection->SetUInt64(new_entry, val_des, map_val.GetUInt64Value());
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_UINT32:
        reflection->SetUInt32(new_entry, val_des, map_val.GetUInt32Value());
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_BOOL:
        reflection->SetBool(new_entry, val_des, map_val.GetBoolValue());
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_DOUBLE:
        reflection->SetDouble(new_entry, val_des, map_val.GetDoubleValue());
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_FLOAT:
        reflection->SetFloat(new_entry, val_des, map_val.GetFloatValue());
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_ENUM:
        reflection->SetEnumValue(new_entry, val_des, map_val.GetEnumValue());
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_MESSAGE: {
        const Message& message = map_val.GetMessageValue();
        reflection->MutableMessage(new_entry, val_des)->CopyFrom(message);
        break;
      }
    }
  }
}